

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void stack_node_add_link(StackNode *self,StackLink link,SubtreePool *subtree_pool)

{
  Subtree self_00;
  StackNode *pSVar1;
  StackLink SVar2;
  _Bool _Var3;
  ushort uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int32_t iVar8;
  char cVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  StackLink *pSVar14;
  Subtree *pSVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  
  SVar2 = link;
  if (link.node != self) {
    uVar17 = (ulong)self->link_count;
    bVar18 = uVar17 != 0;
    if (bVar18) {
      pSVar15 = &self->links[0].subtree;
      uVar16 = 1;
      do {
        self_00 = (Subtree)pSVar15->ptr;
        if (self_00.ptr == link.subtree.ptr) {
LAB_00131669:
          pSVar1 = (StackNode *)pSVar15[-1].ptr;
          if (pSVar1 == link.node) {
            iVar13 = 0;
            if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
               ((link.subtree.ptr)->child_count != 0)) {
              iVar13 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
            }
            iVar8 = 0;
            if ((((ulong)self_00.ptr & 1) == 0) && (iVar8 = 0, (self_00.ptr)->child_count != 0)) {
              iVar8 = ((self_00.ptr)->field_17).field_0.dynamic_precedence;
            }
            if (iVar8 < iVar13) {
              ts_subtree_retain(link.subtree);
              ts_subtree_release(subtree_pool,*(SubtreeHeapData **)pSVar15);
              *pSVar15 = link.subtree;
              iVar13 = 0;
              if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
                 (iVar13 = 0, (link.subtree.ptr)->child_count != 0)) {
                iVar13 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
              }
              self->dynamic_precedence = iVar13 + (link.node)->dynamic_precedence;
            }
          }
          else {
            if (((TSStateId)*(uint32_t *)&pSVar1->state != (link.node)->state) ||
               ((pSVar1->position).bytes != ((link.node)->position).bytes)) goto LAB_0013168e;
            if ((link.node)->link_count != 0) {
              pSVar14 = (link.node)->links;
              uVar17 = 0;
              do {
                stack_node_add_link((StackNode *)pSVar15[-1].ptr,*pSVar14,subtree_pool);
                uVar17 = uVar17 + 1;
                pSVar14 = pSVar14 + 1;
              } while (uVar17 < (link.node)->link_count);
            }
            iVar13 = (link.node)->dynamic_precedence;
            if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
              iVar12 = 0;
              if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
                 (iVar12 = 0, (link.subtree.ptr)->child_count != 0)) {
                iVar12 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
              }
              iVar13 = iVar13 + iVar12;
            }
            if (self->dynamic_precedence < iVar13) {
              self->dynamic_precedence = iVar13;
            }
          }
          if (bVar18) {
            return;
          }
          break;
        }
        if (self_00.ptr != (SubtreeHeapData *)0x0 && link.subtree.ptr != (SubtreeHeapData *)0x0) {
          if (((ulong)self_00.ptr & 1) == 0) {
            uVar4 = (self_00.ptr)->symbol;
          }
          else {
            uVar4 = (ushort)self_00.data.symbol;
          }
          uVar10 = (ushort)link.subtree._1_1_;
          if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
            uVar10 = (link.subtree.ptr)->symbol;
          }
          if (uVar4 == uVar10) {
            if (((ulong)self_00.ptr & 1) == 0) {
              uVar5 = *(uint *)&(self_00.ptr)->field_0x2c >> 7;
            }
            else {
              uVar5 = (uint)((ulong)self_00.ptr >> 5) & 0x7ffffff;
            }
            uVar6 = uVar5 & 1;
            cVar9 = (char)uVar6;
            if (uVar6 != 0) {
              uVar6 = 0x262;
            }
            if (cVar9 == '\0' && ((ulong)self_00.ptr & 1) == 0) {
              uVar6 = (self_00.ptr)->error_cost;
            }
            if (uVar6 != 0) {
              uVar5 = (uint)((ulong)link.subtree.ptr >> 5);
              if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                uVar5 = *(uint *)&(link.subtree.ptr)->field_0x2c >> 7;
              }
              uVar5 = uVar5 & 1;
              uVar11 = uVar5;
              if (uVar5 != 0) {
                uVar11 = 0x262;
              }
              if ((char)uVar5 == '\0' &&
                  ((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                uVar11 = (link.subtree.ptr)->error_cost;
              }
              if (uVar11 != 0) goto LAB_00131669;
            }
            if (((ulong)self_00.ptr & 1) == 0) {
              uVar6 = ((self_00.ptr)->padding).bytes;
            }
            else {
              uVar6 = self_00._2_4_ & 0xff;
            }
            uVar7 = link.subtree._2_4_ & 0xff;
            if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
              uVar7 = ((link.subtree.ptr)->padding).bytes;
            }
            if (uVar6 == uVar7) {
              if (((ulong)self_00.ptr & 1) == 0) {
                uVar6 = ((self_00.ptr)->size).bytes;
              }
              else {
                uVar6 = self_00._3_4_ & 0xff;
              }
              uVar7 = link.subtree._3_4_ & 0xff;
              if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                uVar7 = ((link.subtree.ptr)->size).bytes;
              }
              if (uVar6 == uVar7) {
                uVar7 = 0;
                uVar6 = 0;
                if (((ulong)self_00.ptr & 1) == 0) {
                  uVar6 = (self_00.ptr)->child_count;
                }
                if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                  uVar7 = (link.subtree.ptr)->child_count;
                }
                if (uVar6 == uVar7) {
                  if (((ulong)self_00.ptr & 1) == 0) {
                    uVar5 = *(uint *)&(self_00.ptr)->field_0x2c >> 2;
                  }
                  else {
                    uVar5 = (uint)((ulong)self_00.ptr >> 3) & 0x1fffffff;
                  }
                  uVar11 = (uint)((ulong)link.subtree.ptr >> 3);
                  if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                    uVar11 = *(uint *)&(link.subtree.ptr)->field_0x2c >> 2;
                  }
                  if (((uVar5 & 1) == (uVar11 & 1)) &&
                     (_Var3 = ts_subtree_external_scanner_state_eq(self_00,link.subtree), _Var3))
                  goto LAB_00131669;
                }
              }
            }
          }
        }
LAB_0013168e:
        bVar18 = uVar16 < uVar17;
        pSVar15 = pSVar15 + 3;
        bVar19 = uVar16 != uVar17;
        uVar16 = uVar16 + 1;
      } while (bVar19);
    }
    if (self->link_count != 8) {
      stack_node_retain(link.node);
      uVar5 = (link.node)->node_count;
      iVar13 = (link.node)->dynamic_precedence;
      uVar4 = self->link_count;
      self->link_count = uVar4 + 1;
      self->links[uVar4].is_pending = link.is_pending;
      *(undefined7 *)&self->links[uVar4].field_0x11 = link._17_7_;
      self->links[uVar4].node = link.node;
      self->links[uVar4].subtree = link.subtree;
      if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_retain(link.subtree);
        uVar6 = 1;
        if ((((undefined1  [24])SVar2 & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
           ((link.subtree.ptr)->child_count != 0)) {
          uVar6 = ((link.subtree.ptr)->field_17).field_0.node_count;
        }
        iVar12 = 0;
        if ((((undefined1  [24])SVar2 & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
           (iVar12 = 0, (link.subtree.ptr)->child_count != 0)) {
          iVar12 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
        }
        uVar5 = uVar5 + uVar6;
        iVar13 = iVar13 + iVar12;
      }
      if (self->node_count < uVar5) {
        self->node_count = uVar5;
      }
      if (self->dynamic_precedence < iVar13) {
        self->dynamic_precedence = iVar13;
      }
    }
  }
  return;
}

Assistant:

static void stack_node_add_link(StackNode *self, StackLink link, SubtreePool *subtree_pool) {
  if (link.node == self) return;

  for (int i = 0; i < self->link_count; i++) {
    StackLink *existing_link = &self->links[i];
    if (stack__subtree_is_equivalent(existing_link->subtree, link.subtree)) {
      // In general, we preserve ambiguities until they are removed from the stack
      // during a pop operation where multiple paths lead to the same node. But in
      // the special case where two links directly connect the same pair of nodes,
      // we can safely remove the ambiguity ahead of time without changing behavior.
      if (existing_link->node == link.node) {
        if (
          ts_subtree_dynamic_precedence(link.subtree) >
          ts_subtree_dynamic_precedence(existing_link->subtree)
        ) {
          ts_subtree_retain(link.subtree);
          ts_subtree_release(subtree_pool, existing_link->subtree);
          existing_link->subtree = link.subtree;
          self->dynamic_precedence =
            link.node->dynamic_precedence + ts_subtree_dynamic_precedence(link.subtree);
        }
        return;
      }

      // If the previous nodes are mergeable, merge them recursively.
      if (existing_link->node->state == link.node->state &&
          existing_link->node->position.bytes == link.node->position.bytes) {
        for (int j = 0; j < link.node->link_count; j++) {
          stack_node_add_link(existing_link->node, link.node->links[j], subtree_pool);
        }
        int32_t dynamic_precedence = link.node->dynamic_precedence;
        if (link.subtree.ptr) {
          dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
        }
        if (dynamic_precedence > self->dynamic_precedence) {
          self->dynamic_precedence = dynamic_precedence;
        }
        return;
      }
    }
  }

  if (self->link_count == MAX_LINK_COUNT) return;

  stack_node_retain(link.node);
  unsigned node_count = link.node->node_count;
  int dynamic_precedence = link.node->dynamic_precedence;
  self->links[self->link_count++] = link;

  if (link.subtree.ptr) {
    ts_subtree_retain(link.subtree);
    node_count += ts_subtree_node_count(link.subtree);
    dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
  }

  if (node_count > self->node_count) self->node_count = node_count;
  if (dynamic_precedence > self->dynamic_precedence) self->dynamic_precedence = dynamic_precedence;
}